

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

void __thiscall
btAlignedObjectArray<btWheelInfo>::push_back
          (btAlignedObjectArray<btWheelInfo> *this,btWheelInfo *_Val)

{
  btWheelInfo *pbVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  int _Count;
  btWheelInfo *pbVar5;
  btWheelInfo *pbVar6;
  byte bVar7;
  
  bVar7 = 0;
  iVar3 = this->m_size;
  if (iVar3 == this->m_capacity) {
    _Count = 1;
    if (iVar3 != 0) {
      _Count = iVar3 * 2;
    }
    reserve(this,_Count);
    iVar3 = this->m_size;
  }
  pbVar1 = this->m_data;
  pbVar5 = _Val;
  pbVar6 = pbVar1 + iVar3;
  for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
    *(undefined8 *)(pbVar6->m_raycastInfo).m_contactNormalWS.m_floats =
         *(undefined8 *)(pbVar5->m_raycastInfo).m_contactNormalWS.m_floats;
    pbVar5 = (btWheelInfo *)((long)pbVar5 + (ulong)bVar7 * -0x10 + 8);
    pbVar6 = (btWheelInfo *)((long)pbVar6 + (ulong)bVar7 * -0x10 + 8);
  }
  uVar2 = *(undefined8 *)((_Val->m_worldTransform).m_basis.m_el[0].m_floats + 2);
  *(undefined8 *)pbVar1[iVar3].m_worldTransform.m_basis.m_el[0].m_floats =
       *(undefined8 *)(_Val->m_worldTransform).m_basis.m_el[0].m_floats;
  *(undefined8 *)(pbVar1[iVar3].m_worldTransform.m_basis.m_el[0].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((_Val->m_worldTransform).m_basis.m_el[1].m_floats + 2);
  *(undefined8 *)pbVar1[iVar3].m_worldTransform.m_basis.m_el[1].m_floats =
       *(undefined8 *)(_Val->m_worldTransform).m_basis.m_el[1].m_floats;
  *(undefined8 *)(pbVar1[iVar3].m_worldTransform.m_basis.m_el[1].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((_Val->m_worldTransform).m_basis.m_el[2].m_floats + 2);
  *(undefined8 *)pbVar1[iVar3].m_worldTransform.m_basis.m_el[2].m_floats =
       *(undefined8 *)(_Val->m_worldTransform).m_basis.m_el[2].m_floats;
  *(undefined8 *)(pbVar1[iVar3].m_worldTransform.m_basis.m_el[2].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((_Val->m_worldTransform).m_origin.m_floats + 2);
  *(undefined8 *)pbVar1[iVar3].m_worldTransform.m_origin.m_floats =
       *(undefined8 *)(_Val->m_worldTransform).m_origin.m_floats;
  *(undefined8 *)(pbVar1[iVar3].m_worldTransform.m_origin.m_floats + 2) = uVar2;
  memcpy(&pbVar1[iVar3].m_chassisConnectionPointCS,&_Val->m_chassisConnectionPointCS,0x88);
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

SIMD_FORCE_INLINE	void push_back(const T& _Val)
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			
#ifdef BT_USE_PLACEMENT_NEW
			new ( &m_data[m_size] ) T(_Val);
#else
			m_data[size()] = _Val;			
#endif //BT_USE_PLACEMENT_NEW

			m_size++;
		}